

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void moira::sprintd_signed(char **s,i64 value)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  
  if (value < 0) {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    *pcVar1 = '-';
    value = -value;
  }
  if (value == 0) {
    uVar2 = 1;
  }
  else {
    dVar4 = log10((double)value);
    uVar2 = (int)dVar4 + 1;
  }
  if (0 < (int)uVar2) {
    lVar3 = (ulong)uVar2 + 1;
    do {
      (*s)[lVar3 + -2] = (char)value + (char)((ulong)value / 10) * -10 | 0x30;
      lVar3 = lVar3 + -1;
      value = (ulong)value / 10;
    } while (1 < lVar3);
  }
  *s = *s + (int)uVar2;
  return;
}

Assistant:

static void sprintd_signed(char *&s, i64 value)
{
    if (value < 0) { *s++ = '-'; value *= -1; }
    sprintd(s, value, decDigits(value));
}